

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_12::PathVerifier::VerifyPolicyMappings
          (PathVerifier *this,ParsedCertificate *cert,CertErrors *errors)

{
  less<bssl::der::Input> *this_00;
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  pointer pPVar3;
  pointer pmVar4;
  _Base_ptr __y;
  Span<const_unsigned_char> lhs;
  Input policy;
  bool bVar5;
  vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_> *pvVar6;
  iterator iVar7;
  mapped_type *this_01;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
  *this_02;
  iterator iVar9;
  pointer pPVar10;
  long lVar11;
  _Base_ptr p_Var12;
  ParsedCertificate *pPVar13;
  ParsedCertificate *pPVar14;
  _Self __tmp;
  _Base_ptr *pp_Var15;
  _Base_ptr p_Var16;
  Input rhs;
  Input rhs_00;
  Input rhs_01;
  Input rhs_02;
  undefined1 local_68 [32];
  size_t local_48;
  key_type local_40;
  
  if (cert->has_policy_mappings_ != true) {
    return;
  }
  pPVar13 = cert;
  pvVar6 = ParsedCertificate::policy_mappings(cert);
  pPVar10 = (pvVar6->
            super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (pvVar6->
           super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pPVar10 == pPVar3) {
      if (this->policy_mapping_ == 0) goto LAB_0038bf87;
      pvVar6 = ParsedCertificate::policy_mappings(cert);
      pPVar10 = (pvVar6->
                super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pPVar3 = (pvVar6->
               super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pPVar14 = (ParsedCertificate *)(local_68 + 0x18);
      goto LAB_0038be6b;
    }
    rhs.data_.size_ = 4;
    rhs.data_.data_ = "U\x1d ";
    bVar5 = bssl::der::operator==((Input)(pPVar10->issuer_domain_policy).data_,rhs);
    if (bVar5) break;
    pPVar13 = (ParsedCertificate *)(pPVar10->subject_domain_policy).data_.size_;
    rhs_00.data_.size_ = 4;
    rhs_00.data_.data_ = "U\x1d ";
    bVar5 = bssl::der::operator==((Input)(pPVar10->subject_domain_policy).data_,rhs_00);
    pPVar10 = pPVar10 + 1;
  } while (!bVar5);
  ValidPolicyGraph::SetNull(&this->valid_policy_graph_);
  CertErrors::AddError(errors,"PolicyMappings must not map anyPolicy");
  return;
LAB_0038be6b:
  if (pPVar10 == pPVar3) {
    if (this->policy_mapping_ != 0) {
      return;
    }
LAB_0038bf87:
    pvVar6 = ParsedCertificate::policy_mappings(cert);
    pPVar10 = (pvVar6->
              super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (pvVar6->
             super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (pPVar10 == pPVar3) {
        return;
      }
      local_68._0_8_ = (pPVar10->issuer_domain_policy).data_.data_;
      local_68._8_8_ = (pPVar10->issuer_domain_policy).data_.size_;
      pmVar4 = (this->valid_policy_graph_).levels_.
               super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->valid_policy_graph_).levels_.
          super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pmVar4) break;
LAB_0038c07b:
      pPVar10 = pPVar10 + 1;
    }
    this_00 = (less<bssl::der::Input> *)(pmVar4 + -1);
    pp_Var15 = &pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &pmVar4[-1]._M_t._M_impl.super__Rb_tree_header;
    iVar9._M_node = &p_Var1->_M_header;
    while( true ) {
      __y = *pp_Var15;
      pPVar14 = (ParsedCertificate *)local_68;
      p_Var16 = iVar9._M_node;
      if (__y == (_Base_ptr)0x0) goto LAB_0038c020;
      p_Var12 = __y + 1;
      pPVar13 = (ParsedCertificate *)p_Var12;
      bVar5 = ::std::less<bssl::der::Input>::operator()(this_00,(Input *)p_Var12,(Input *)pPVar14);
      if (!bVar5) break;
      lVar11 = 0x18;
      p_Var12 = iVar9._M_node;
      pPVar14 = pPVar13;
LAB_0038c015:
      pp_Var15 = (_Base_ptr *)((long)&__y->_M_color + lVar11);
      pPVar13 = pPVar14;
      iVar9._M_node = p_Var12;
    }
    bVar5 = ::std::less<bssl::der::Input>::operator()(this_00,(Input *)pPVar14,(Input *)p_Var12);
    lVar11 = 0x10;
    p_Var12 = __y;
    if (bVar5) goto LAB_0038c015;
    pPVar13 = (ParsedCertificate *)__y->_M_left;
    p_Var12 = __y->_M_right;
    iVar9 = ::std::
            _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
            ::_M_lower_bound((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                              *)this_00,(_Link_type)pPVar13,__y,(Input *)local_68);
    for (; p_Var12 != (_Base_ptr)0x0; p_Var12 = (&p_Var12->_M_left)[!bVar5]) {
      pPVar13 = (ParsedCertificate *)local_68;
      bVar5 = ::std::less<bssl::der::Input>::operator()
                        (this_00,(Input *)pPVar13,(Input *)(p_Var12 + 1));
      if (bVar5) {
        p_Var16 = p_Var12;
      }
    }
LAB_0038c020:
    if ((pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left == iVar9._M_node) &&
       (p_Var1 == (_Rb_tree_header *)p_Var16)) {
      ::std::
      _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
      ::_M_erase((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                  *)pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Link_type)pPVar13);
      pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    }
    else {
      while (iVar9._M_node != p_Var16) {
        p_Var8 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(iVar9._M_node);
        pPVar13 = (ParsedCertificate *)p_Var1;
        this_02 = (_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                   *)::std::_Rb_tree_rebalance_for_erase(iVar9._M_node,&p_Var1->_M_header);
        ::std::
        _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
        ::_M_drop_node(this_02,(_Link_type)pPVar13);
        psVar2 = &pmVar4[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar2 = *psVar2 - 1;
        iVar9._M_node = p_Var8;
      }
    }
    goto LAB_0038c07b;
  }
  local_68._24_8_ = (pPVar10->issuer_domain_policy).data_.data_;
  local_48 = (pPVar10->issuer_domain_policy).data_.size_;
  local_40.data_.data_ = (pPVar10->subject_domain_policy).data_.data_;
  pPVar13 = (ParsedCertificate *)(pPVar10->subject_domain_policy).data_.size_;
  lhs = (pPVar10->subject_domain_policy).data_;
  rhs_01.data_.size_ = 4;
  rhs_01.data_.data_ = "U\x1d ";
  local_40.data_.size_ = (size_t)pPVar13;
  bVar5 = bssl::der::operator!=((Input)(pPVar10->issuer_domain_policy).data_,rhs_01);
  if (!bVar5) {
    __assert_fail("issuer_policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x2a2,
                  "void bssl::(anonymous namespace)::ValidPolicyGraph::AddPolicyMapping(der::Input, der::Input)"
                 );
  }
  rhs_02.data_.size_ = 4;
  rhs_02.data_.data_ = "U\x1d ";
  bVar5 = bssl::der::operator!=((Input)lhs,rhs_02);
  if (!bVar5) {
    __assert_fail("subject_policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x2a3,
                  "void bssl::(anonymous namespace)::ValidPolicyGraph::AddPolicyMapping(der::Input, der::Input)"
                 );
  }
  pmVar4 = (this->valid_policy_graph_).levels_.
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->valid_policy_graph_).levels_.
      super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pmVar4) {
    pPVar13 = pPVar14;
    iVar7 = ::std::
            map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
            ::find(pmVar4 + -1,(key_type *)pPVar14);
    if ((_Rb_tree_header *)iVar7._M_node ==
        &(this->valid_policy_graph_).levels_.
         super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t._M_impl.super__Rb_tree_header) {
      if ((this->valid_policy_graph_).current_level_.has_any_policy != true) goto LAB_0038bf52;
      policy.data_.size_ = local_48;
      policy.data_.data_ = (uchar *)local_68._24_8_;
      local_68._0_8_ = (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
      local_68._8_8_ = (pointer)0x0;
      local_68._16_8_ = (pointer)0x0;
      iVar7 = ValidPolicyGraph::AddNodeReturningIterator
                        (&this->valid_policy_graph_,policy,
                         (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)local_68);
      ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
                ((_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)local_68);
    }
    *(undefined1 *)&iVar7._M_node[2]._M_parent = 1;
    this_01 = ::std::
              map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
              ::operator[](&(this->valid_policy_graph_).current_level_.expected_policy_map,&local_40
                          );
    pPVar13 = pPVar14;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              (this_01,(value_type *)pPVar14);
  }
LAB_0038bf52:
  pPVar10 = pPVar10 + 1;
  goto LAB_0038be6b;
}

Assistant:

void PathVerifier::VerifyPolicyMappings(const ParsedCertificate &cert,
                                        CertErrors *errors) {
  if (!cert.has_policy_mappings()) {
    return;
  }

  // From RFC 5280 section 6.1.4:
  //
  //  (a)  If a policy mappings extension is present, verify that the
  //       special value anyPolicy does not appear as an
  //       issuerDomainPolicy or a subjectDomainPolicy.
  for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
    if (mapping.issuer_domain_policy == der::Input(kAnyPolicyOid) ||
        mapping.subject_domain_policy == der::Input(kAnyPolicyOid)) {
      // Because this implementation continues processing certificates after
      // this error, clear the valid policy graph to ensure the
      // "user_constrained_policy_set" output upon failure is empty.
      valid_policy_graph_.SetNull();
      errors->AddError(cert_errors::kPolicyMappingAnyPolicy);
      return;
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //     (1)  If the policy_mapping variable is greater than 0, for each
  //          node in the valid_policy_tree of depth i where ID-P is the
  //          valid_policy, set expected_policy_set to the set of
  //          subjectDomainPolicy values that are specified as
  //          equivalent to ID-P by the policy mappings extension.
  //
  //          If no node of depth i in the valid_policy_tree has a
  //          valid_policy of ID-P but there is a node of depth i with a
  //          valid_policy of anyPolicy, then generate a child node of
  //          the node of depth i-1 that has a valid_policy of anyPolicy
  //          as follows:
  //
  //        (i)    set the valid_policy to ID-P;
  //
  //        (ii)   set the qualifier_set to the qualifier set of the
  //               policy anyPolicy in the certificate policies
  //               extension of certificate i; and
  //
  //        (iii)  set the expected_policy_set to the set of
  //               subjectDomainPolicy values that are specified as
  //               equivalent to ID-P by the policy mappings extension.
  //
  if (policy_mapping_ > 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.AddPolicyMapping(mapping.issuer_domain_policy,
                                           mapping.subject_domain_policy);
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //  ...
  //
  //     (2)  If the policy_mapping variable is equal to 0:
  //
  //        (i)    delete each node of depth i in the valid_policy_tree
  //               where ID-P is the valid_policy.
  //
  //        (ii)   If there is a node in the valid_policy_tree of depth
  //               i-1 or less without any child nodes, delete that
  //               node.  Repeat this step until there are no nodes of
  //               depth i-1 or less without children.
  //
  // Step (ii) is deferred to part of GetUserConstrainedPolicySet().
  if (policy_mapping_ == 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.DeleteNode(mapping.issuer_domain_policy);
    }
  }
}